

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkItem.h
# Opt level: O0

void __thiscall
cmLinkImplItem::cmLinkImplItem
          (cmLinkImplItem *this,string *n,cmGeneratorTarget *t,cmListFileBacktrace *bt,
          bool fromGenex)

{
  bool fromGenex_local;
  cmListFileBacktrace *bt_local;
  cmGeneratorTarget *t_local;
  string *n_local;
  cmLinkImplItem *this_local;
  
  cmLinkItem::cmLinkItem(&this->super_cmLinkItem,n,t);
  cmListFileBacktrace::cmListFileBacktrace(&this->Backtrace,bt);
  this->FromGenex = fromGenex;
  return;
}

Assistant:

cmLinkImplItem(std::string const& n, cmGeneratorTarget const* t,
                 cmListFileBacktrace const& bt, bool fromGenex)
    : cmLinkItem(n, t)
    , Backtrace(bt)
    , FromGenex(fromGenex)
  {
  }